

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O0

void synchronize(void)

{
  int iVar1;
  long lVar2;
  int64_t eval_b;
  int64_t eval_a;
  int current;
  
  synchronize_nowait();
  iVar1 = step;
  while (iVar1 == step) {
    uv_cond_wait(&condvar,&mutex);
  }
  lVar2 = (long)(iVar1 + 1);
  if (step != lVar2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
            ,0x68,"step","==","current + 1",(long)step,"==",lVar2);
    abort();
  }
  return;
}

Assistant:

static void synchronize(void) {
  int current;

  synchronize_nowait();
  /* Wait for the other thread.  Guard against spurious wakeups. */
  for (current = step; current == step; uv_cond_wait(&condvar, &mutex));
  ASSERT_EQ(step, current + 1);
}